

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Check_Browser.cxx
# Opt level: O1

void __thiscall Fl_Check_Browser::clear(Fl_Check_Browser *this)

{
  cb_item *pcVar1;
  cb_item *__ptr;
  
  __ptr = this->first;
  if (__ptr != (cb_item *)0x0) {
    Fl_Browser_::new_list(&this->super_Fl_Browser_);
    do {
      pcVar1 = __ptr->next;
      free(__ptr->text);
      free(__ptr);
      __ptr = pcVar1;
    } while (pcVar1 != (cb_item *)0x0);
    this->nitems_ = 0;
    this->nchecked_ = 0;
    this->first = (cb_item *)0x0;
    this->last = (cb_item *)0x0;
    this->cached_item = -1;
  }
  return;
}

Assistant:

void Fl_Check_Browser::clear() {
	cb_item *p = first;
	cb_item *next;

	if (p == 0) {
		return;
	}

	new_list();
	do {
		next = p->next;
		free(p->text);
		free(p);
		p = next;
	} while (p);

	first = last = 0;
	nitems_ = nchecked_ = 0;
	cached_item = -1;
}